

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O1

unsigned_long Imf_2_5::uiMult<unsigned_long>(unsigned_long a,unsigned_long b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  OverflowExc *this;
  
  if ((a != 0) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = a, auVar2._8_8_ = 0, auVar2._0_8_ = b,
     SUB168(auVar1 * auVar2,8) != 0)) {
    this = (OverflowExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::OverflowExc::OverflowExc(this,"Integer multiplication overflow.");
    __cxa_throw(this,&Iex_2_5::OverflowExc::typeinfo,Iex_2_5::OverflowExc::~OverflowExc);
  }
  return b * a;
}

Assistant:

T
uiMult (T a, T b)
{
    //
    // Unsigned integer multiplication
    //

    IMF_STATIC_ASSERT (!std::numeric_limits<T>::is_signed &&
                        std::numeric_limits<T>::is_integer);

    if (a > 0 && b > std::numeric_limits<T>::max() / a)
        throw IEX_NAMESPACE::OverflowExc ("Integer multiplication overflow.");

    return a * b;
}